

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_AActor_A_Overlay(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  uint layer_00;
  uint uVar1;
  int iVar2;
  DObject *this;
  AActor *this_00;
  player_t *this_01;
  MetaClass *pMVar3;
  VMValue *pVVar4;
  DPSprite *pDVar5;
  size_t len;
  bool bVar6;
  bool local_96;
  bool local_93;
  int u_1;
  DPSprite *pspr;
  int u;
  player_t *player;
  FState *pFStack_60;
  bool dontoverride;
  FState *state;
  int layer;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x519,
                  "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar6) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x519,
                  "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_93 = true;
  if (this != (DObject *)0x0) {
    local_93 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_93 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x519,
                  "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x519,
                  "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar6 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar6 = true, param[1].field_0.field_1.atag != 1)) {
    bVar6 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (!bVar6) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x519,
                  "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this_00 = (AActor *)param[1].field_0.field_1.a;
  local_96 = true;
  if (this_00 != (AActor *)0x0) {
    local_96 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
  }
  if (local_96 == false) {
    __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x519,
                  "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x519,
                  "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x03') {
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x519,
                  "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x51a,
                  "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x51a,
                  "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  layer_00 = param[3].field_0.i;
  if (numparam < 5) {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    if ((pVVar4->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                    ,0x51b,
                    "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    uVar1 = (pVVar4->field_0).i;
    pMVar3 = AActor::GetClass(this_00);
    len = (size_t)uVar1;
    pFStack_60 = FStateLabelStorage::GetState(&StateLabels,uVar1,pMVar3,false);
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                    ,0x51b,
                    "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar1 = param[4].field_0.i;
    pMVar3 = AActor::GetClass(this_00);
    len = (size_t)uVar1;
    pFStack_60 = FStateLabelStorage::GetState(&StateLabels,uVar1,pMVar3,false);
  }
  if (numparam < 6) {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    if ((pVVar4->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                    ,0x51c,
                    "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    len = 5;
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    iVar2 = (pVVar4->field_0).i;
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                    ,0x51c,
                    "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = param[5].field_0.i;
  }
  this_01 = (player_t *)this[0xe]._vptr_DObject;
  if (this_01 == (player_t *)0x0) {
LAB_005d5bb5:
    if (numret < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                      ,0x522,
                      "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
        ;
      }
      VMReturn::SetInt(ret,0);
      param_local._4_4_ = 1;
    }
  }
  else {
    if (iVar2 != 0) {
      len = (size_t)layer_00;
      pDVar5 = player_t::FindPSprite(this_01,layer_00);
      if (pDVar5 != (DPSprite *)0x0) goto LAB_005d5bb5;
    }
    pDVar5 = (DPSprite *)DObject::operator_new((DObject *)0x88,len);
    DPSprite::DPSprite(pDVar5,this_01,this_00,layer_00);
    DPSprite::SetState(pDVar5,pFStack_60,false);
    if (numret < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                      ,0x528,
                      "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
        ;
      }
      VMReturn::SetInt(ret,1);
      param_local._4_4_ = 1;
    }
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Overlay)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT		(layer);
	PARAM_STATE_ACTION_DEF(state);
	PARAM_BOOL_DEF(dontoverride);

	player_t *player = self->player;

	if (player == nullptr || (dontoverride && (player->FindPSprite(layer) != nullptr)))
	{
		ACTION_RETURN_BOOL(false);
	}

	DPSprite *pspr;
	pspr = new DPSprite(player, stateowner, layer);
	pspr->SetState(state);
	ACTION_RETURN_BOOL(true);
}